

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_xml_generator.cc
# Opt level: O2

void __thiscall
t_xml_generator::write_element_number<double>(t_xml_generator *this,string *name,double n)

{
  string local_48;
  string local_28;
  
  std::__cxx11::string::string((string *)&local_28,(string *)name);
  number_to_string<double>(&local_48,this,n);
  write_element_string(this,&local_28,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void write_element_number(string name, T n) {
    write_element_string(name, number_to_string(n));
  }